

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_piecewise_merge_join.cpp
# Opt level: O3

void __thiscall
duckdb::PiecewiseMergeJoinState::ResolveJoinKeys(PiecewiseMergeJoinState *this,DataChunk *input)

{
  unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true> *this_00;
  unique_ptr<duckdb::PhysicalRangeJoin::LocalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::LocalSortedTable>,_true>
  *this_01;
  bool bVar1;
  ClientContext *pCVar2;
  _Head_base<0UL,_duckdb::GlobalSortState_*,_false> __ptr_00;
  PhysicalPiecewiseMergeJoin *op;
  _Head_base<0UL,_duckdb::PhysicalRangeJoin::LocalSortedTable_*,_false> __ptr_01;
  _Head_base<0UL,_duckdb::PayloadScanner_*,_false> __ptr_02;
  _Head_base<0UL,_duckdb::GlobalSortState_*,_false> this_02;
  _Head_base<0UL,_duckdb::PhysicalRangeJoin::LocalSortedTable_*,_false> this_03;
  pointer pLVar3;
  type pGVar4;
  pointer pGVar5;
  reference this_04;
  pointer pSVar6;
  type sorted_data;
  _Head_base<0UL,_duckdb::PayloadScanner_*,_false> this_05;
  pointer this_06;
  pointer pLVar7;
  DataChunk *this_07;
  pointer *__ptr_1;
  pointer *__ptr;
  pointer *__ptr_2;
  undefined1 local_70 [24];
  _Head_base<0UL,_duckdb::SBScanState_*,_false> local_58;
  __uniq_ptr_impl<duckdb::SBScanState,_std::default_delete<duckdb::SBScanState>_> local_50;
  _Head_base<0UL,_duckdb::SortedBlock_*,_false> local_48;
  __uniq_ptr_impl<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>_> local_40;
  
  pCVar2 = this->context;
  this_02._M_head_impl = (GlobalSortState *)operator_new(0x2b8);
  GlobalSortState::GlobalSortState(this_02._M_head_impl,pCVar2,&this->lhs_order,&this->lhs_layout);
  this_00 = &this->lhs_global_state;
  __ptr_00._M_head_impl =
       (this->lhs_global_state).
       super_unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::GlobalSortState_*,_std::default_delete<duckdb::GlobalSortState>_>
       .super__Head_base<0UL,_duckdb::GlobalSortState_*,_false>._M_head_impl;
  (this->lhs_global_state).
  super_unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>_>._M_t.
  super___uniq_ptr_impl<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::GlobalSortState_*,_std::default_delete<duckdb::GlobalSortState>_>.
  super__Head_base<0UL,_duckdb::GlobalSortState_*,_false>._M_head_impl = this_02._M_head_impl;
  if (__ptr_00._M_head_impl != (GlobalSortState *)0x0) {
    ::std::default_delete<duckdb::GlobalSortState>::operator()
              ((default_delete<duckdb::GlobalSortState> *)this_00,__ptr_00._M_head_impl);
  }
  pCVar2 = this->context;
  op = this->op;
  this_03._M_head_impl = (LocalSortedTable *)operator_new(0x170);
  PhysicalRangeJoin::LocalSortedTable::LocalSortedTable
            (this_03._M_head_impl,pCVar2,&op->super_PhysicalRangeJoin,0);
  this_01 = &this->lhs_local_table;
  __ptr_01._M_head_impl =
       (this->lhs_local_table).
       super_unique_ptr<duckdb::PhysicalRangeJoin::LocalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::LocalSortedTable>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::PhysicalRangeJoin::LocalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::LocalSortedTable>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::PhysicalRangeJoin::LocalSortedTable_*,_std::default_delete<duckdb::PhysicalRangeJoin::LocalSortedTable>_>
       .super__Head_base<0UL,_duckdb::PhysicalRangeJoin::LocalSortedTable_*,_false>._M_head_impl;
  (this->lhs_local_table).
  super_unique_ptr<duckdb::PhysicalRangeJoin::LocalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::LocalSortedTable>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::PhysicalRangeJoin::LocalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::LocalSortedTable>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::PhysicalRangeJoin::LocalSortedTable_*,_std::default_delete<duckdb::PhysicalRangeJoin::LocalSortedTable>_>
  .super__Head_base<0UL,_duckdb::PhysicalRangeJoin::LocalSortedTable_*,_false>._M_head_impl =
       this_03._M_head_impl;
  if (__ptr_01._M_head_impl != (LocalSortedTable *)0x0) {
    ::std::default_delete<duckdb::PhysicalRangeJoin::LocalSortedTable>::operator()
              ((default_delete<duckdb::PhysicalRangeJoin::LocalSortedTable> *)this_01,
               __ptr_01._M_head_impl);
  }
  pLVar3 = unique_ptr<duckdb::PhysicalRangeJoin::LocalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::LocalSortedTable>,_true>
           ::operator->(this_01);
  pGVar4 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>::
           operator*(this_00);
  PhysicalRangeJoin::LocalSortedTable::Sink(pLVar3,input,pGVar4);
  bVar1 = this->force_external;
  pGVar5 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>::
           operator->(this_00);
  pGVar5->external = bVar1;
  pGVar5 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>::
           operator->(this_00);
  pLVar3 = unique_ptr<duckdb::PhysicalRangeJoin::LocalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::LocalSortedTable>,_true>
           ::operator->(this_01);
  GlobalSortState::AddLocalState(pGVar5,&pLVar3->local_sort_state);
  pGVar5 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>::
           operator->(this_00);
  GlobalSortState::PrepareMergePhase(pGVar5);
  pGVar5 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>::
           operator->(this_00);
  if (8 < (ulong)((long)(pGVar5->sorted_blocks).
                        super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                        .
                        super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(pGVar5->sorted_blocks).
                       super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                       .
                       super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)) {
    do {
      pGVar4 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
               ::operator*(this_00);
      MergeSorter::MergeSorter((MergeSorter *)local_70,pGVar4,this->buffer_manager);
      MergeSorter::PerformInMergeRound((MergeSorter *)local_70);
      pGVar5 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
               ::operator->(this_00);
      GlobalSortState::CompleteMergeRound(pGVar5,false);
      if ((_Tuple_impl<0UL,_duckdb::SortedBlock_*,_std::default_delete<duckdb::SortedBlock>_>)
          local_40._M_t.
          super__Tuple_impl<0UL,_duckdb::SortedBlock_*,_std::default_delete<duckdb::SortedBlock>_>.
          super__Head_base<0UL,_duckdb::SortedBlock_*,_false>._M_head_impl != (SortedBlock *)0x0) {
        ::std::default_delete<duckdb::SortedBlock>::operator()
                  ((default_delete<duckdb::SortedBlock> *)&local_40,
                   (SortedBlock *)
                   local_40._M_t.
                   super__Tuple_impl<0UL,_duckdb::SortedBlock_*,_std::default_delete<duckdb::SortedBlock>_>
                   .super__Head_base<0UL,_duckdb::SortedBlock_*,_false>._M_head_impl);
      }
      local_40._M_t.
      super__Tuple_impl<0UL,_duckdb::SortedBlock_*,_std::default_delete<duckdb::SortedBlock>_>.
      super__Head_base<0UL,_duckdb::SortedBlock_*,_false>._M_head_impl =
           (tuple<duckdb::SortedBlock_*,_std::default_delete<duckdb::SortedBlock>_>)0x0;
      if (local_48._M_head_impl != (SortedBlock *)0x0) {
        ::std::default_delete<duckdb::SortedBlock>::operator()
                  ((default_delete<duckdb::SortedBlock> *)&local_48,local_48._M_head_impl);
      }
      local_48._M_head_impl = (SortedBlock *)0x0;
      if (local_50._M_t.
          super__Tuple_impl<0UL,_duckdb::SBScanState_*,_std::default_delete<duckdb::SBScanState>_>.
          super__Head_base<0UL,_duckdb::SBScanState_*,_false>._M_head_impl !=
          (_Tuple_impl<0UL,_duckdb::SBScanState_*,_std::default_delete<duckdb::SBScanState>_>)0x0) {
        ::std::default_delete<duckdb::SBScanState>::operator()
                  ((default_delete<duckdb::SBScanState> *)&local_50,
                   (SBScanState *)
                   local_50._M_t.
                   super__Tuple_impl<0UL,_duckdb::SBScanState_*,_std::default_delete<duckdb::SBScanState>_>
                   .super__Head_base<0UL,_duckdb::SBScanState_*,_false>._M_head_impl);
      }
      local_50._M_t.
      super__Tuple_impl<0UL,_duckdb::SBScanState_*,_std::default_delete<duckdb::SBScanState>_>.
      super__Head_base<0UL,_duckdb::SBScanState_*,_false>._M_head_impl =
           (tuple<duckdb::SBScanState_*,_std::default_delete<duckdb::SBScanState>_>)
           (_Tuple_impl<0UL,_duckdb::SBScanState_*,_std::default_delete<duckdb::SBScanState>_>)0x0;
      if (local_58._M_head_impl != (SBScanState *)0x0) {
        ::std::default_delete<duckdb::SBScanState>::operator()
                  ((default_delete<duckdb::SBScanState> *)&local_58,local_58._M_head_impl);
      }
      pGVar5 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
               ::operator->(this_00);
    } while (8 < (ulong)((long)(pGVar5->sorted_blocks).
                               super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                               .
                               super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pGVar5->sorted_blocks).
                              super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                              .
                              super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                              ._M_impl.super__Vector_impl_data._M_start));
  }
  pGVar5 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>::
           operator->(this_00);
  this_04 = vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>
            ::operator[](&pGVar5->sorted_blocks,0);
  pSVar6 = unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>::
           operator->(this_04);
  sorted_data = unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true>::
                operator*(&pSVar6->payload_data);
  pGVar4 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>::
           operator*(this_00);
  this_05._M_head_impl = (PayloadScanner *)operator_new(0x18);
  PayloadScanner::PayloadScanner(this_05._M_head_impl,sorted_data,pGVar4,true);
  __ptr_02._M_head_impl =
       (this->scanner).
       super_unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>._M_t.
       super___uniq_ptr_impl<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::PayloadScanner_*,_std::default_delete<duckdb::PayloadScanner>_>
       .super__Head_base<0UL,_duckdb::PayloadScanner_*,_false>._M_head_impl;
  (this->scanner).
  super_unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>._M_t.
  super___uniq_ptr_impl<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::PayloadScanner_*,_std::default_delete<duckdb::PayloadScanner>_>.
  super__Head_base<0UL,_duckdb::PayloadScanner_*,_false>._M_head_impl = this_05._M_head_impl;
  if (__ptr_02._M_head_impl != (PayloadScanner *)0x0) {
    ::std::default_delete<duckdb::PayloadScanner>::operator()
              ((default_delete<duckdb::PayloadScanner> *)&this->scanner,__ptr_02._M_head_impl);
  }
  this_07 = &this->lhs_payload;
  DataChunk::Reset(this_07);
  this_06 = unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>,_true>::
            operator->(&this->scanner);
  PayloadScanner::Scan(this_06,this_07);
  pLVar3 = unique_ptr<duckdb::PhysicalRangeJoin::LocalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::LocalSortedTable>,_true>
           ::operator->(this_01);
  DataChunk::Reset(&pLVar3->keys);
  pLVar3 = unique_ptr<duckdb::PhysicalRangeJoin::LocalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::LocalSortedTable>,_true>
           ::operator->(this_01);
  pLVar7 = unique_ptr<duckdb::PhysicalRangeJoin::LocalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::LocalSortedTable>,_true>
           ::operator->(this_01);
  ExpressionExecutor::Execute(&pLVar3->executor,this_07,&pLVar7->keys);
  return;
}

Assistant:

void ResolveJoinKeys(DataChunk &input) {
		// sort by join key
		lhs_global_state = make_uniq<GlobalSortState>(context, lhs_order, lhs_layout);
		lhs_local_table = make_uniq<LocalSortedTable>(context, op, 0U);
		lhs_local_table->Sink(input, *lhs_global_state);

		// Set external (can be forced with the PRAGMA)
		lhs_global_state->external = force_external;
		lhs_global_state->AddLocalState(lhs_local_table->local_sort_state);
		lhs_global_state->PrepareMergePhase();
		while (lhs_global_state->sorted_blocks.size() > 1) {
			MergeSorter merge_sorter(*lhs_global_state, buffer_manager);
			merge_sorter.PerformInMergeRound();
			lhs_global_state->CompleteMergeRound();
		}

		// Scan the sorted payload
		D_ASSERT(lhs_global_state->sorted_blocks.size() == 1);

		scanner = make_uniq<PayloadScanner>(*lhs_global_state->sorted_blocks[0]->payload_data, *lhs_global_state);
		lhs_payload.Reset();
		scanner->Scan(lhs_payload);

		// Recompute the sorted keys from the sorted input
		lhs_local_table->keys.Reset();
		lhs_local_table->executor.Execute(lhs_payload, lhs_local_table->keys);
	}